

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void menu_init(menu_conflict *menu,skin_id id,menu_iter *iter)

{
  menu_skin_conflict *pmVar1;
  menu_skin_conflict *skin;
  menu_iter *iter_local;
  skin_id id_local;
  menu_conflict *menu_local;
  
  pmVar1 = menu_find_skin(id);
  if (pmVar1 == (menu_skin_conflict *)0x0) {
    __assert_fail("skin && \"menu skin not found!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                  ,0x3c3,"void menu_init(struct menu *, skin_id, const menu_iter *)");
  }
  if (iter == (menu_iter *)0x0) {
    __assert_fail("iter && \"menu iter not found!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                  ,0x3c4,"void menu_init(struct menu *, skin_id, const menu_iter *)");
  }
  memset(menu,0,0xb0);
  menu->row_funcs = iter;
  menu->skin = pmVar1;
  menu->cursor = 0;
  menu->cursor_x_offset = 0;
  return;
}

Assistant:

void menu_init(struct menu *menu, skin_id id, const menu_iter *iter)
{
	const menu_skin *skin = menu_find_skin(id);
	assert(skin && "menu skin not found!");
	assert(iter && "menu iter not found!");

	/* Wipe the struct */
	memset(menu, 0, sizeof *menu);

	/* Menu-specific initialisation */
	menu->row_funcs = iter;
	menu->skin = skin;
	menu->cursor = 0;
	menu->cursor_x_offset = 0;
}